

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatbuffers.h
# Opt level: O0

void __thiscall
flatbuffers::FlatBufferBuilder::PreAlign(FlatBufferBuilder *this,size_t len,size_t alignment)

{
  uoffset_t uVar1;
  size_t zero_pad_bytes;
  size_t alignment_local;
  size_t len_local;
  FlatBufferBuilder *this_local;
  
  uVar1 = GetSize(this);
  zero_pad_bytes = PaddingBytes(uVar1 + len,alignment);
  vector_downward::fill(&this->buf_,zero_pad_bytes);
  return;
}

Assistant:

void PreAlign(size_t len, size_t alignment) {
    buf_.fill(PaddingBytes(GetSize() + len, alignment));
  }